

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O1

void ircode_register_dump(ircode_t *code)

{
  ulong uVar1;
  uint32_t i;
  ulong uVar2;
  
  uVar1 = (ulong)(uint)(code->registers).n;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      printf("[%d]\t%d\n",uVar2 & 0xffffffff,(ulong)(code->registers).p[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    return;
  }
  puts("EMPTY");
  return;
}

Assistant:

void ircode_register_dump (ircode_t *code) {
    uint32_t n = (uint32_t)marray_size(code->registers);
    if (n == 0) printf("EMPTY\n");
    for (uint32_t i=0; i<n; ++i) {
        uint32_t value = marray_get(code->registers, i);
        printf("[%d]\t%d\n", i, value);
    }
}